

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
detail::reader::operator()(reader *this,optional_field<example::decimal_t,_1UL> *val)

{
  uint uVar1;
  byte *pbVar2;
  undefined8 uVar3;
  
  if ((this->opts_).super_type.m_initialized != false) {
    if (((this->opts_).super_type.m_storage.dummy_.data[0] & 2U) != 0) {
      pbVar2 = (byte *)(this->buf_).data_;
      uVar1 = *(uint *)(pbVar2 + ((this->buf_).size_ != 0));
      (val->super_optional<example::decimal_t>).super_type.m_storage.dummy_ =
           (dummy_u)((ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18) << 0x20 | (ulong)*pbVar2);
      if ((val->super_optional<example::decimal_t>).super_type.m_initialized == false) {
        (val->super_optional<example::decimal_t>).super_type.m_initialized = true;
      }
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar3,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> & val) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
            val = example::optional_field<T, N>(std::move(v));
        }
    }